

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall Fossilize::StreamArchive::has_entry(StreamArchive *this,ResourceTag tag,Hash hash)

{
  bool bVar1;
  size_type sVar2;
  Hash local_28;
  Hash hash_local;
  StreamArchive *pSStack_18;
  ResourceTag tag_local;
  StreamArchive *this_local;
  
  local_28 = hash;
  hash_local._4_4_ = tag;
  pSStack_18 = this;
  bVar1 = DatabaseInterface::test_resource_filter(&this->super_DatabaseInterface,tag,hash);
  if (bVar1) {
    if (this->imported_metadata == (ExportedMetadataHeader *)0x0) {
      sVar2 = std::
              unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
              ::count(this->seen_blobs + hash_local._4_4_,&local_28);
      this_local._7_1_ = sVar2 != 0;
    }
    else {
      this_local._7_1_ =
           find_entry_from_metadata(this->imported_metadata,hash_local._4_4_,local_28,(Entry *)0x0);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool has_entry(ResourceTag tag, Hash hash) override
	{
		if (!test_resource_filter(tag, hash))
			return false;

		if (imported_metadata)
			return find_entry_from_metadata(imported_metadata, tag, hash, nullptr);
		else
			return seen_blobs[tag].count(hash) != 0;
	}